

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

XMLAttribute * __thiscall tinyxml2::XMLElement::FindOrCreateAttribute(XMLElement *this,char *name)

{
  char *pcVar1;
  XMLAttribute *pXVar2;
  XMLAttribute **ppXVar3;
  long lVar4;
  char *pcVar5;
  char cVar6;
  XMLAttribute *pXVar7;
  
  pXVar2 = this->_rootAttribute;
  if (this->_rootAttribute == (XMLAttribute *)0x0) {
    pXVar7 = (XMLAttribute *)0x0;
  }
  else {
    do {
      pXVar7 = pXVar2;
      pcVar1 = StrPair::GetStr(&pXVar7->_name);
      if (pcVar1 == name) {
        return pXVar7;
      }
      cVar6 = *pcVar1;
      pcVar5 = name;
      if (cVar6 != '\0') {
        lVar4 = 0;
        do {
          if ((cVar6 != name[lVar4]) || ((int)lVar4 == 0x7fffffff)) {
            if ((int)lVar4 == 0x7fffffff) {
              return pXVar7;
            }
            goto LAB_001bb9cf;
          }
          cVar6 = pcVar1[lVar4 + 1];
          lVar4 = lVar4 + 1;
        } while (cVar6 != '\0');
        if ((int)lVar4 == 0x7fffffff) {
          return pXVar7;
        }
        pcVar5 = name + lVar4;
      }
      if (*pcVar5 == '\0') {
        return pXVar7;
      }
LAB_001bb9cf:
      pXVar2 = pXVar7->_next;
    } while (pXVar7->_next != (XMLAttribute *)0x0);
  }
  pXVar2 = (XMLAttribute *)MemPoolT<72>::Alloc(&((this->super_XMLNode)._document)->_attributePool);
  pXVar2->_vptr_XMLAttribute = (_func_int **)&PTR__XMLAttribute_00277ae0;
  (pXVar2->_name)._flags = 0;
  (pXVar2->_name)._start = (char *)0x0;
  (pXVar2->_name)._end = (char *)0x0;
  (pXVar2->_value)._flags = 0;
  (pXVar2->_value)._start = (char *)0x0;
  (pXVar2->_value)._end = (char *)0x0;
  pXVar2->_next = (XMLAttribute *)0x0;
  pXVar2->_memPool = (MemPool *)0x0;
  pXVar2->_memPool = &(((this->super_XMLNode)._document)->_attributePool).super_MemPool;
  ppXVar3 = &pXVar7->_next;
  if (pXVar7 == (XMLAttribute *)0x0) {
    ppXVar3 = &this->_rootAttribute;
  }
  *ppXVar3 = pXVar2;
  StrPair::SetStr(&pXVar2->_name,name,0);
  (*pXVar2->_memPool->_vptr_MemPool[5])();
  return pXVar2;
}

Assistant:

XMLAttribute* XMLElement::FindOrCreateAttribute( const char* name )
{
    XMLAttribute* last = 0;
    XMLAttribute* attrib = 0;
    for( attrib = _rootAttribute;
            attrib;
            last = attrib, attrib = attrib->_next ) {
        if ( XMLUtil::StringEqual( attrib->Name(), name ) ) {
            break;
        }
    }
    if ( !attrib ) {
        TIXMLASSERT( sizeof( XMLAttribute ) == _document->_attributePool.ItemSize() );
        attrib = new (_document->_attributePool.Alloc() ) XMLAttribute();
        attrib->_memPool = &_document->_attributePool;
        if ( last ) {
            last->_next = attrib;
        }
        else {
            _rootAttribute = attrib;
        }
        attrib->SetName( name );
        attrib->_memPool->SetTracked(); // always created and linked.
    }
    return attrib;
}